

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_imply_m3(REF_DBL *m,REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2)

{
  REF_STATUS RVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_68 [4];
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  REF_DBL local_20 [3];
  
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    m[lVar2] = 0.0;
  }
  dVar3 = *xyz0 - *xyz1;
  dVar4 = *xyz1 - *xyz2;
  local_68[0] = dVar3 * dVar3;
  local_68[1] = dVar4 * dVar4;
  dVar5 = *xyz2 - *xyz0;
  local_38 = xyz0[1] - xyz1[1];
  local_68[2] = dVar5 * dVar5;
  local_68[3] = (dVar3 + dVar3) * local_38;
  local_48 = xyz1[1] - xyz2[1];
  local_28 = xyz2[1] - xyz0[1];
  local_38 = local_38 * local_38;
  dStack_30 = local_48 * local_48;
  local_48 = (dVar4 + dVar4) * local_48;
  dStack_40 = (dVar5 + dVar5) * local_28;
  local_28 = local_28 * local_28;
  for (lVar2 = 9; lVar2 != 0xc; lVar2 = lVar2 + 1) {
    local_68[lVar2] = 1.0;
  }
  RVar1 = ref_matrix_solve_ab(3,4,local_68);
  if (RVar1 == 0) {
    *m = local_20[0];
    m[1] = local_20[1];
    m[2] = 0.0;
    m[3] = local_20[2];
    *(undefined4 *)(m + 4) = 0;
    *(undefined4 *)((long)m + 0x24) = 0;
    *(undefined4 *)(m + 5) = 0;
    *(undefined4 *)((long)m + 0x2c) = 0x3ff00000;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_imply_m3(REF_DBL *m, REF_DBL *xyz0, REF_DBL *xyz1,
                                       REF_DBL *xyz2) {
  REF_DBL ab[12];
  REF_INT i;

  for (i = 0; i < 6; i++) m[i] = 0.0;

  fill_ab3(0, xyz0, xyz1);
  fill_ab3(1, xyz1, xyz2);
  fill_ab3(2, xyz2, xyz0);

  for (i = 0; i < 3; i++) ab[i + 3 * 3] = 1.0;

  RAISE(ref_matrix_solve_ab(3, 4, ab));

  m[0] = ab[0 + 3 * 3];
  m[1] = ab[1 + 3 * 3];
  m[2] = 0.0;
  m[3] = ab[2 + 3 * 3];
  m[4] = 0.0;
  m[5] = 1.0;

  return REF_SUCCESS;
}